

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

void __thiscall
helics::TimeDependencies::removeDependency(TimeDependencies *this,GlobalFederateId gid)

{
  DependencyInfo *pDVar1;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  __position;
  
  pDVar1 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  __position = std::
               lower_bound<__gnu_cxx::__normal_iterator<helics::DependencyInfo*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::GlobalFederateId,helics::__0>
                         ((this->dependencies).
                          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,pDVar1);
  if (((__position._M_current != pDVar1) && (((__position._M_current)->fedID).gid == gid.gid)) &&
     ((__position._M_current)->dependency = false, (__position._M_current)->dependent == false)) {
    std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::erase
              (&this->dependencies,(const_iterator)__position._M_current);
    return;
  }
  return;
}

Assistant:

void TimeDependencies::removeDependency(GlobalFederateId gid)
{
    auto dep = std::lower_bound(dependencies.begin(), dependencies.end(), gid, dependencyCompare);
    if (dep != dependencies.end()) {
        if (dep->fedID == gid) {
            dep->dependency = false;
            if (!dep->dependent) {
                dependencies.erase(dep);
            }
        }
    }
}